

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseEndTag2(xmlParserCtxtPtr ctxt,xmlStartTag *tag)

{
  int *piVar1;
  int iVar2;
  xmlParserInputPtr pxVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  endElementNsSAX2Func p_Var6;
  int *piVar7;
  xmlChar *pxVar8;
  byte *pbVar9;
  byte bVar10;
  xmlChar *pxVar11;
  xmlChar xVar12;
  byte *pbVar13;
  byte *pbVar14;
  bool bVar15;
  xmlHashedString xVar16;
  xmlHashedString p;
  
  pxVar3 = ctxt->input;
  if (((pxVar3->flags & 0x40) == 0) && ((long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
    xmlParserGrow(ctxt);
  }
  pxVar3 = ctxt->input;
  pxVar4 = pxVar3->cur;
  if ((*pxVar4 != '<') || (pxVar4[1] != '/')) {
    xmlFatalErr(ctxt,XML_ERR_LTSLASH_REQUIRED,(char *)0x0);
    return;
  }
  pxVar3->cur = pxVar4 + 2;
  pxVar3->col = pxVar3->col + 2;
  if (pxVar4[2] == '\0') {
    xmlParserGrow(ctxt);
  }
  pxVar4 = tag->prefix;
  pbVar14 = ctxt->name;
  if (pxVar4 == (xmlChar *)0x0) {
    pbVar13 = xmlParseNameAndCompare(ctxt,pbVar14);
  }
  else {
    pxVar3 = ctxt->input;
    if (((pxVar3->flags & 0x40) == 0) && ((long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
    pxVar3 = ctxt->input;
    pxVar5 = pxVar3->cur;
    xVar12 = *pxVar5;
    pxVar8 = pxVar5;
    pxVar11 = pxVar4;
    if (xVar12 == '\0') {
      bVar15 = false;
    }
    else {
      do {
        if (xVar12 != *pxVar11) break;
        pxVar11 = pxVar11 + 1;
        xVar12 = pxVar8[1];
        pxVar8 = pxVar8 + 1;
      } while (xVar12 != '\0');
      bVar15 = xVar12 == ':';
    }
    if ((bVar15) && (*pxVar11 == '\0')) {
      bVar10 = pxVar8[1];
      pbVar13 = pbVar14;
      while ((pxVar11 = pxVar8 + 1, bVar10 != 0 && (bVar10 == *pbVar13))) {
        pbVar13 = pbVar13 + 1;
        bVar10 = pxVar8[2];
        pxVar8 = pxVar11;
      }
      if (((*pbVar13 == 0) && (bVar10 < 0x3f)) &&
         ((0x4000000100002600U >> ((ulong)bVar10 & 0x3f) & 1) != 0)) {
        pxVar3->col = pxVar3->col + ((int)pxVar11 - (int)pxVar5);
        pxVar3->cur = pxVar11;
        pbVar13 = &DAT_00000001;
        goto LAB_00141ca0;
      }
    }
    xVar16 = xmlParseQNameHashed(ctxt,&p);
    pbVar9 = xVar16.name;
    if (pbVar9 == (byte *)0x0) {
      pbVar13 = (byte *)0x0;
    }
    else {
      pbVar13 = &DAT_00000001;
      if (pxVar4 != p.name || pbVar14 != pbVar9) {
        pbVar13 = pbVar9;
      }
    }
  }
LAB_00141ca0:
  pxVar3 = ctxt->input;
  if (((pxVar3->flags & 0x40) == 0) && ((long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
    xmlParserGrow(ctxt);
  }
  xmlSkipBlankChars(ctxt);
  pxVar3 = ctxt->input;
  pxVar4 = pxVar3->cur;
  if (*pxVar4 == '>') {
    pxVar3->col = pxVar3->col + 1;
    pxVar3->cur = pxVar4 + 1;
    if (pxVar4[1] == '\0') {
      xmlParserGrow(ctxt);
    }
  }
  else {
    xmlFatalErr(ctxt,XML_ERR_GT_REQUIRED,(char *)0x0);
  }
  if (pbVar13 != &DAT_00000001) {
    pbVar14 = (byte *)"unparsable";
    if (pbVar13 != (byte *)0x0) {
      pbVar14 = pbVar13;
    }
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_TAG_NAME_MISMATCH,XML_ERR_FATAL,
               ctxt->name,pbVar14,(xmlChar *)0x0,tag->line,
               "Opening and ending tag mismatch: %s line %d and %s\n",ctxt->name,
               (ulong)(uint)tag->line,pbVar14);
  }
  if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
      (p_Var6 = ctxt->sax->endElementNs, p_Var6 != (endElementNsSAX2Func)0x0)) &&
     (ctxt->disableSAX == 0)) {
    (*p_Var6)(ctxt->userData,ctxt->name,tag->prefix,tag->URI);
  }
  iVar2 = ctxt->spaceNr;
  if (0 < (long)iVar2) {
    ctxt->spaceNr = iVar2 + -1;
    piVar1 = ctxt->spaceTab + (long)iVar2 + -2;
    piVar7 = ctxt->spaceTab;
    if (iVar2 != 1) {
      piVar7 = piVar1;
    }
    ctxt->space = piVar7;
    piVar1[1] = -1;
  }
  if (tag->nsNr == 0) {
    return;
  }
  xmlParserNsPop(ctxt,tag->nsNr);
  return;
}

Assistant:

static void
xmlParseEndTag2(xmlParserCtxtPtr ctxt, const xmlStartTag *tag) {
    const xmlChar *name;

    GROW;
    if ((RAW != '<') || (NXT(1) != '/')) {
	xmlFatalErr(ctxt, XML_ERR_LTSLASH_REQUIRED, NULL);
	return;
    }
    SKIP(2);

    if (tag->prefix == NULL)
        name = xmlParseNameAndCompare(ctxt, ctxt->name);
    else
        name = xmlParseQNameAndCompare(ctxt, ctxt->name, tag->prefix);

    /*
     * We should definitely be at the ending "S? '>'" part
     */
    GROW;
    SKIP_BLANKS;
    if ((!IS_BYTE_CHAR(RAW)) || (RAW != '>')) {
	xmlFatalErr(ctxt, XML_ERR_GT_REQUIRED, NULL);
    } else
	NEXT1;

    /*
     * [ WFC: Element Type Match ]
     * The Name in an element's end-tag must match the element type in the
     * start-tag.
     *
     */
    if (name != (xmlChar*)1) {
        if (name == NULL) name = BAD_CAST "unparsable";
        xmlFatalErrMsgStrIntStr(ctxt, XML_ERR_TAG_NAME_MISMATCH,
		     "Opening and ending tag mismatch: %s line %d and %s\n",
		                ctxt->name, tag->line, name);
    }

    /*
     * SAX: End of Tag
     */
    if ((ctxt->sax != NULL) && (ctxt->sax->endElementNs != NULL) &&
	(!ctxt->disableSAX))
	ctxt->sax->endElementNs(ctxt->userData, ctxt->name, tag->prefix,
                                tag->URI);

    spacePop(ctxt);
    if (tag->nsNr != 0)
	xmlParserNsPop(ctxt, tag->nsNr);
}